

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O1

int coda_pcre2_substring_copy_bynumber_8
              (pcre2_match_data_8 *match_data,uint32_t stringnumber,PCRE2_UCHAR8 *buffer,
              size_t *sizeptr)

{
  int iVar1;
  size_t size;
  size_t local_30;
  
  iVar1 = coda_pcre2_substring_length_bynumber_8(match_data,stringnumber,&local_30);
  if (-1 < iVar1) {
    iVar1 = -0x30;
    if (local_30 + 1 <= *sizeptr) {
      memcpy(buffer,match_data->subject + match_data->ovector[stringnumber * 2],local_30);
      buffer[local_30] = '\0';
      *sizeptr = local_30;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_copy_bynumber(pcre2_match_data *match_data,
  uint32_t stringnumber, PCRE2_UCHAR *buffer, PCRE2_SIZE *sizeptr)
{
int rc;
PCRE2_SIZE size;
rc = pcre2_substring_length_bynumber(match_data, stringnumber, &size);
if (rc < 0) return rc;
if (size + 1 > *sizeptr) return PCRE2_ERROR_NOMEMORY;
memcpy(buffer, match_data->subject + match_data->ovector[stringnumber*2],
  CU2BYTES(size));
buffer[size] = 0;
*sizeptr = size;
return 0;
}